

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3ExprIterate2(Fts3Expr *pExpr,int *piPhrase,_func_int_Fts3Expr_ptr_int_void_ptr *x,void *pCtx
                    )

{
  int iVar1;
  _func_int_Fts3Expr_ptr_int_void_ptr *in_RCX;
  code *in_RDX;
  Fts3Expr *in_RSI;
  uint *in_RDI;
  int eType;
  int rc;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffdc;
  
  uVar2 = *in_RDI;
  if (uVar2 == 5) {
    iVar1 = (*in_RDX)(in_RDI,in_RSI->eType,in_RCX);
    in_RSI->eType = in_RSI->eType + 1;
  }
  else {
    iVar1 = fts3ExprIterate2(in_RSI,(int *)in_RDX,in_RCX,
                             (void *)CONCAT44(in_stack_ffffffffffffffdc,uVar2));
    if ((iVar1 == 0) && (uVar2 != 2)) {
      iVar1 = fts3ExprIterate2(in_RSI,(int *)in_RDX,in_RCX,(void *)(ulong)uVar2);
    }
  }
  return iVar1;
}

Assistant:

static int fts3ExprIterate2(
  Fts3Expr *pExpr,                /* Expression to iterate phrases of */
  int *piPhrase,                  /* Pointer to phrase counter */
  int (*x)(Fts3Expr*,int,void*),  /* Callback function to invoke for phrases */
  void *pCtx                      /* Second argument to pass to callback */
){
  int rc;                         /* Return code */
  int eType = pExpr->eType;       /* Type of expression node pExpr */

  if( eType!=FTSQUERY_PHRASE ){
    assert( pExpr->pLeft && pExpr->pRight );
    rc = fts3ExprIterate2(pExpr->pLeft, piPhrase, x, pCtx);
    if( rc==SQLITE_OK && eType!=FTSQUERY_NOT ){
      rc = fts3ExprIterate2(pExpr->pRight, piPhrase, x, pCtx);
    }
  }else{
    rc = x(pExpr, *piPhrase, pCtx);
    (*piPhrase)++;
  }
  return rc;
}